

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

int do_stackoverflow(int incallp)

{
  StackWord *source68k;
  DLword DVar1;
  bool bVar2;
  bool bVar3;
  DLword DVar4;
  StackWord SVar5;
  ushort uVar6;
  LispPTR LVar7;
  int iVar8;
  StackWord *dest68k;
  DLword *pDVar9;
  uint uVar10;
  uint nw;
  uint uVar11;
  StackWord *SAddr;
  ulong uVar12;
  ushort *puVar13;
  StackWord *start68k;
  DLword *pDVar14;
  ushort *SAddr_00;
  
  pDVar9 = MachineState.pvar;
  if (*NeedHardreturnCleanup_word != 0) {
    warn("HardreturnCleanup in do_stackoverflow");
  }
  if (incallp == 0) {
    DVar1 = 0;
  }
  else {
    DVar1 = MachineState.pvar[-5];
  }
  MachineState.csp = MachineState.csp + 2;
  DVar4 = StackOffsetFromNative(MachineState.csp);
  MachineState.pvar[-5] = DVar4;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  pDVar14 = MachineState.pvar;
  start68k = (StackWord *)(MachineState.pvar + -10);
  uVar6 = MachineState.pvar[-5];
  LVar7 = LAddrFromNative(start68k);
  uVar10 = (uint)uVar6 - (LVar7 & 0xffff);
  nw = ((uint)uVar6 - (LVar7 & 0xffff)) + 2;
  puVar13 = (ushort *)((ulong)((uint)pDVar14[-5] * 2) + (long)Stackspace);
  bVar3 = false;
  bVar2 = false;
  do {
    if (puVar13[1] == 0xa000) {
      uVar12 = (ulong)*puVar13;
      SAddr_00 = puVar13 + uVar12;
      if (SAddr_00[1] == 0xa000) {
        uVar6 = 0xa000;
        while (uVar6 == 0xa000) {
          uVar6 = (short)uVar12 + *SAddr_00;
          uVar12 = (ulong)uVar6;
          *puVar13 = uVar6;
          SAddr_00 = SAddr_00 + *SAddr_00;
          uVar6 = SAddr_00[1];
        }
        goto LAB_001253c5;
      }
      DVar4 = StackOffsetFromNative(SAddr_00);
      if ((DVar4 != InterfacePage->endofstack) ||
         ((DVar4 = StackOffsetFromNative(SAddr_00), (ushort)*GuardStackAddr_word < DVar4 &&
          (bVar2 = true, *STACKOVERFLOW_word == 0)))) goto LAB_00125224;
      pDVar14 = extendstack();
      if (pDVar14 == (DLword *)0x0) goto LAB_0012544a;
      goto LAB_001253c5;
    }
LAB_00125224:
    if ((*pDVar14 & 0x200000000000000) == 0) {
      uVar11 = 0xffffffff;
    }
    else {
      uVar11 = 0xffffffff;
      if (pDVar14[-3] == 1) {
        LVar7 = LAddrFromNative(start68k);
        uVar11 = LVar7 & 3 ^ 2;
        bVar3 = true;
      }
    }
    dest68k = (StackWord *)freestackblock((DLword)nw,start68k,uVar11);
    if (dest68k == (StackWord *)0x0) goto LAB_0012544a;
    if (dest68k < Stackspace) {
      error("freestackblock returned gunk.");
    }
    if ((!bVar2) || (dest68k <= start68k)) {
      source68k = (StackWord *)(pDVar14 + -0xc);
      blt((DLword *)dest68k,(DLword *)source68k,nw);
      dest68k[1].field_0x1 = dest68k[1].field_0x1 | 2;
      SAddr = dest68k + 2;
      DVar4 = StackOffsetFromNative(SAddr);
      dest68k[7] = (StackWord)(DVar4 + (short)uVar10);
      if ((pDVar14[-10] & 1) == 0) {
        LVar7 = LAddrFromNative(source68k);
        SVar5 = SUB42(LVar7,0);
      }
      else {
        SVar5 = *(StackWord *)(pDVar14 + -1);
      }
      dest68k[0xb] = SVar5;
      uVar11 = *(uint *)(dest68k + 2);
      if ((uVar11 & 1) == 0) {
        dest68k[10] = SUB42(uVar11,0);
        *(uint *)(dest68k + 2) = uVar11 | 1;
      }
      if (bVar3) {
        *(int *)(dest68k + 8) =
             *(int *)(dest68k + 8) + (int)((ulong)((long)SAddr - (long)start68k) >> 1);
      }
      if ((*pDVar14 & 0x2000000) == 0) {
        nw = uVar10;
        if ((int)uVar10 < 1) {
          error("creating 0 length free stack block");
        }
      }
      else {
        start68k = source68k;
        if ((int)uVar10 < -1) {
          error("creating 0 length free stack block");
        }
      }
      if ((uVar10 & 1) != 0) {
        error("creating odd length free stack block");
      }
      *(uint *)start68k = nw & 0xffff | 0xa0000000;
      start68k = SAddr;
LAB_001253c5:
      DVar4 = StackOffsetFromNative(start68k);
      if (DVar4 == 0xffff) {
LAB_0012544a:
        MachineState.irqcheck = 0;
        MachineState.irqend = 0;
        iVar8 = 1;
      }
      else {
        MachineState.pvar = (DLword *)NativeAligned4FromStackOffset(DVar4 + 10);
        uVar12 = (ulong)((long)MachineState.pvar - (long)pDVar9) >> 1;
        pDVar14 = (DLword *)
                  ((ulong)((uint)*(ushort *)((long)MachineState.pvar + -10) * 2) + (long)Stackspace)
        ;
        pDVar9 = pDVar14;
        if (*(short *)((ulong)pDVar14 ^ 2) != -0x6000) {
          error("pre_moveframe: MP9316");
        }
        while (*(short *)((ulong)pDVar9 ^ 2) == -0x6000) {
          MachineState.endofstack = pDVar9 + *(ushort *)((ulong)(pDVar9 + 1) ^ 2);
          pDVar9 = MachineState.endofstack;
        }
        MachineState.csp = pDVar14 + -2;
        iVar8 = 0;
        if (incallp != 0) {
          MachineState.pvar[-5] = DVar1 + (short)uVar12;
          MachineState.ivar = MachineState.ivar + (int)uVar12;
        }
      }
      return iVar8;
    }
    dest68k[1] = (StackWord)0xa000;
    bVar2 = true;
    if (*dest68k == (StackWord)0x0) {
      error("0-long stack freeblock.");
      bVar2 = true;
    }
  } while( true );
}

Assistant:

int do_stackoverflow(int incallp) {
  DLword newfx;
  DLword savenext;
  DLword *oldPVar;
  int movedistance;
#ifdef STACKCHECK
  LispPTR stackcontents;
  LispPTR TopIVAR;

  stackcontents = *((LispPTR *)CurrentStackPTR);
  TopIVAR = *((LispPTR *)IVar);
#endif

  /* Don't care PC,FuncObj, */
  /* if incall flag ON, don't care that IVar
       became residual, and it is pointed to by copied FX's BLINK */
  oldPVar = PVar;

  if (*NeedHardreturnCleanup_word) { warn("HardreturnCleanup in do_stackoverflow"); }
  if (incallp) { savenext = CURRENTFX->nextblock; /* save old nextblock */ }

  BEFORE_CONTEXTSW; /* Don't Use MIDPUNT and Don't care IFPAGE */

  /* Call MOVEFRAME directly */
  if ((newfx = (DLword)moveframe(CURRENTFX)) == 0xFFFF) {
    /* To make immediately call HARDRESET */
    Irq_Stk_Check = 0;
    Irq_Stk_End = 0;
    return (1); /* Whole space exhausted */
  }

  /* Return from MOVEFRAME directly */

  PVar = (DLword *)NativeAligned4FromStackOffset(newfx + FRAMESIZE);
  movedistance = ((UNSIGNED)PVar - (UNSIGNED)oldPVar) >> 1;
  AFTER_CONTEXTSW;

  if (incallp) {
    /* set next(it pointed to old IVar) with offset */
    CURRENTFX->nextblock = savenext + movedistance;

/* including Last Arg(kept in TOS */
#ifdef BIGVM
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr(CURRENTFX->fnheader),
            "in call, but stack frame doesn't match FN being executed.");
#else
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr((CURRENTFX->hi2fnheader << 16) |
                                                           CURRENTFX->lofnheader),
            "in call, but stack frame doesn't match FN being executed.");
#endif /* BIGVM */
    CHECK_FX(CURRENTFX);

    /* We should re-Set up IVAR,CURRENTFX->nextblock */
    IVar += movedistance;
  } /* incallp */

  return (0); /* Normal return */
  /* If  incallp ,we CAN continue executing FN or APPLY by just returning */
  /* new PVar will set in funcall */
}